

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  ImGuiItemStatusFlags *pIVar1;
  ImGuiContext_conflict1 *pIVar2;
  _Bool _Var3;
  ImU32 col;
  ImGuiCol idx;
  char cVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  bool held;
  bool hovered;
  ImRect bb_render;
  ImRect bb_interact;
  bool local_7a;
  bool local_79;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  ImVec2 local_68;
  ImVec2 IStack_60;
  float *local_58;
  float *local_50;
  ImRect local_48;
  ImGuiWindow_conflict *local_38;
  
  pIVar2 = GImGui;
  local_38 = GImGui->CurrentWindow;
  uVar5 = GImGui->CurrentItemFlags;
  GImGui->CurrentItemFlags = uVar5 | 0x18;
  local_78 = hover_visibility_delay;
  local_74 = min_size2;
  local_70 = min_size1;
  local_6c = hover_extend;
  local_58 = size1;
  local_50 = size2;
  _Var3 = ItemAdd(bb,id,(ImRect *)0x0,0);
  pIVar2->CurrentItemFlags = uVar5;
  cVar4 = '\0';
  if (_Var3) {
    fVar6 = 0.0;
    fVar8 = local_6c;
    if (axis == ImGuiAxis_Y) {
      fVar6 = local_6c;
      fVar8 = 0.0;
    }
    local_48.Min.x = (bb->Min).x;
    local_48.Min.y = (bb->Min).y;
    local_48.Min.y = local_48.Min.y - fVar6;
    local_48.Min.x = local_48.Min.x - fVar8;
    local_48.Max.x = (bb->Max).x;
    local_48.Max.y = (bb->Max).y;
    local_48.Max.y = fVar6 + local_48.Max.y;
    local_48.Max.x = fVar8 + local_48.Max.x;
    ButtonBehavior(&local_48,id,&local_79,&local_7a,0x1800);
    if (local_79 == true) {
      pIVar1 = &(pIVar2->LastItemData).StatusFlags;
      *(byte *)pIVar1 = (byte)*pIVar1 | 1;
    }
    if (pIVar2->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if ((local_7a != false) ||
       (((local_79 == true && (pIVar2->HoveredIdPreviousFrame == id)) &&
        (local_78 <= pIVar2->HoveredIdTimer)))) {
      SetMouseCursor((axis != ImGuiAxis_Y) + 3);
    }
    local_68 = bb->Min;
    IStack_60 = bb->Max;
    if (local_7a == true) {
      if (axis == ImGuiAxis_Y) {
        fVar6 = ((pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y) - local_48.Min.y;
      }
      else {
        fVar6 = ((pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x) - local_48.Min.x;
      }
      fVar7 = *local_58 - local_70;
      fVar8 = *local_50 - local_74;
      fVar8 = (float)(~-(uint)(fVar8 <= 0.0) & (uint)fVar8);
      fVar9 = -fVar7;
      uVar5 = -(uint)(fVar7 <= fVar9);
      fVar7 = (float)(~uVar5 & (uint)fVar9 | uVar5 & 0x80000000);
      if (fVar7 <= fVar6) {
        fVar7 = fVar6;
      }
      if (fVar7 <= fVar8) {
        fVar8 = fVar7;
      }
      if ((fVar8 != 0.0) || (NAN(fVar8))) {
        fVar6 = *local_58 + fVar8;
        if ((fVar8 < 0.0) && (fVar6 < local_70)) {
          __assert_fail("*size1 + mouse_delta >= min_size1",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                        ,0x5c8,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        fVar7 = 0.0;
        if ((0.0 < fVar8) && (*local_50 - fVar8 < local_74)) {
          __assert_fail("*size2 - mouse_delta >= min_size2",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                        ,0x5ca,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        *local_58 = fVar6;
        *local_50 = *local_50 - fVar8;
        fVar6 = fVar8;
        if (axis == ImGuiAxis_X) {
          fVar6 = 0.0;
          fVar7 = fVar8;
        }
        local_68.y = local_68.y + fVar6;
        local_68.x = local_68.x + fVar7;
        IStack_60.y = fVar6 + IStack_60.y;
        IStack_60.x = fVar7 + IStack_60.x;
        MarkItemEdited(id);
      }
    }
    idx = 0x1d;
    if ((local_7a == false) && (idx = 0x1b, local_79 == true)) {
      idx = 0x1c - (uint)(pIVar2->HoveredIdTimer < local_78);
    }
    col = GetColorU32(idx,1.0);
    ImDrawList::AddRectFilled(local_38->DrawList,&local_68,&IStack_60,col,0.0,0);
    cVar4 = local_7a;
  }
  return (bool)cVar4;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = g.CurrentItemFlags;
    g.CurrentItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    g.CurrentItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (hovered)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect; // for IsItemHovered(), because bb_interact is larger than bb
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (hovered && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, 0.0f);

    return held;
}